

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMan.c
# Opt level: O1

void If_ManDerefNodeCutSet(If_Man_t *p,If_Obj_t *pObj)

{
  If_Set_t *pIVar1;
  If_Obj_t *pIVar2;
  int iVar3;
  
  if (((undefined1  [112])*pObj & (undefined1  [112])0xf) != (undefined1  [112])0x4) {
    __assert_fail("If_ObjIsAnd(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifMan.c"
                  ,0x26d,"void If_ManDerefNodeCutSet(If_Man_t *, If_Obj_t *)");
  }
  if (-1 < pObj->nVisits) {
    if (pObj->nVisits == 0) {
      pIVar1 = pObj->pCutSet;
      pIVar1->pNext = p->pFreeList;
      p->pFreeList = pIVar1;
      pObj->pCutSet = (If_Set_t *)0x0;
    }
    pIVar2 = pObj->pFanin0;
    if (0 < pIVar2->nVisits) {
      if ((((undefined1  [112])*pIVar2 & (undefined1  [112])0xf) != (undefined1  [112])0x2) &&
         (iVar3 = pIVar2->nVisits + -1, pIVar2->nVisits = iVar3, iVar3 == 0)) {
        pIVar1 = pIVar2->pCutSet;
        pIVar1->pNext = p->pFreeList;
        p->pFreeList = pIVar1;
        pIVar2->pCutSet = (If_Set_t *)0x0;
      }
      pIVar2 = pObj->pFanin1;
      if (0 < pIVar2->nVisits) {
        if ((((undefined1  [112])*pIVar2 & (undefined1  [112])0xf) != (undefined1  [112])0x2) &&
           (iVar3 = pIVar2->nVisits + -1, pIVar2->nVisits = iVar3, iVar3 == 0)) {
          pIVar1 = pIVar2->pCutSet;
          pIVar1->pNext = p->pFreeList;
          p->pFreeList = pIVar1;
          pIVar2->pCutSet = (If_Set_t *)0x0;
        }
        return;
      }
      __assert_fail("pFanin->nVisits > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifMan.c"
                    ,0x281,"void If_ManDerefNodeCutSet(If_Man_t *, If_Obj_t *)");
    }
    __assert_fail("pFanin->nVisits > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifMan.c"
                  ,0x278,"void If_ManDerefNodeCutSet(If_Man_t *, If_Obj_t *)");
  }
  __assert_fail("pObj->nVisits >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifMan.c"
                ,0x26f,"void If_ManDerefNodeCutSet(If_Man_t *, If_Obj_t *)");
}

Assistant:

void If_ManDerefNodeCutSet( If_Man_t * p, If_Obj_t * pObj )
{
    If_Obj_t * pFanin;
    assert( If_ObjIsAnd(pObj) );
    // consider the node
    assert( pObj->nVisits >= 0 );
    if ( pObj->nVisits == 0 )
    {
//        Mem_FixedEntryRecycle( p->pMemSet, (char *)pObj->pCutSet );
        If_ManCutSetRecycle( p, pObj->pCutSet );
        pObj->pCutSet = NULL;
    }
    // consider the first fanin
    pFanin = If_ObjFanin0(pObj);
    assert( pFanin->nVisits > 0 );
    if ( !If_ObjIsCi(pFanin) && --pFanin->nVisits == 0 )
    {
//        Mem_FixedEntryRecycle( p->pMemSet, (char *)pFanin->pCutSet );
        If_ManCutSetRecycle( p, pFanin->pCutSet );
        pFanin->pCutSet = NULL;
    }
    // consider the second fanin
    pFanin = If_ObjFanin1(pObj);
    assert( pFanin->nVisits > 0 );
    if ( !If_ObjIsCi(pFanin) && --pFanin->nVisits == 0 )
    {
//        Mem_FixedEntryRecycle( p->pMemSet, (char *)pFanin->pCutSet );
        If_ManCutSetRecycle( p, pFanin->pCutSet );
        pFanin->pCutSet = NULL;
    }
}